

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  long in_RCX;
  long in_RDI;
  int ret;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int h;
  int w;
  Mat bottom_blob_bordered;
  int in_stack_00000160;
  int in_stack_00000164;
  Mat *in_stack_00000168;
  Mat *in_stack_00000170;
  Mat *in_stack_00000178;
  Mat *in_stack_00000180;
  int in_stack_000001f0;
  int in_stack_000001f8;
  int in_stack_00000200;
  int in_stack_00000208;
  int in_stack_00000210;
  int in_stack_00000218;
  Mat *in_stack_00000220;
  Option *in_stack_00000228;
  Option *in_stack_00000358;
  Mat *in_stack_00000360;
  Mat *in_stack_00000368;
  ConvolutionDepthWise *in_stack_00000370;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Mat local_98;
  int local_2c;
  
  if (((*(byte *)(in_RCX + 0x1e) & 1) == 0) || (*(long *)(in_RDI + 0x178) != 1)) {
    ncnn::Mat::Mat(&local_98);
    make_padding((ConvolutionDepthWise *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (Mat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 (Mat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (Option *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    if (bVar1) {
      local_2c = -100;
    }
    else {
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                        in_stack_fffffffffffffee4,
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        (Allocator *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0))
      ;
      if (bVar1) {
        local_2c = -100;
      }
      else {
        local_2c = convolutiondepthwise
                             (in_stack_00000180,in_stack_00000178,in_stack_00000170,
                              in_stack_00000168,in_stack_00000164,in_stack_00000160,
                              in_stack_000001f0,in_stack_000001f8,in_stack_00000200,
                              in_stack_00000208,in_stack_00000210,in_stack_00000218,
                              in_stack_00000220,in_stack_00000228);
        if (local_2c == 0) {
          local_2c = 0;
        }
      }
    }
    ncnn::Mat::~Mat((Mat *)0x605b78);
  }
  else {
    local_2c = forward_int8(in_stack_00000370,in_stack_00000368,in_stack_00000360,in_stack_00000358)
    ;
  }
  return local_2c;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    //     NCNN_LOGE("ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolutiondepthwise(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}